

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::LineStripRenderer<ImPlot::GetterYs<unsigned_long_long>,_ImPlot::TransformerLogLin>::
operator()(LineStripRenderer<ImPlot::GetterYs<unsigned_long_long>,_ImPlot::TransformerLogLin> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  unsigned_long_long uVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImU32 IVar4;
  uint uVar5;
  GetterYs<unsigned_long_long> *pGVar6;
  TransformerLogLin *pTVar7;
  ImPlotPlot *pIVar8;
  ImDrawVert *pIVar9;
  ImDrawVert *pIVar10;
  ImDrawIdx *pIVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [12];
  double dVar14;
  ImPlotContext *pIVar15;
  int iVar16;
  ImDrawIdx IVar17;
  double dVar18;
  ImVec2 IVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  pIVar15 = GImPlot;
  pGVar6 = this->Getter;
  pTVar7 = this->Transformer;
  iVar16 = pGVar6->Count;
  uVar1 = *(unsigned_long_long *)
           ((long)pGVar6->Ys +
           (long)(((prim + 1 + pGVar6->Offset) % iVar16 + iVar16) % iVar16) * (long)pGVar6->Stride);
  dVar18 = log10(((double)(prim + 1) * pGVar6->XScale + pGVar6->X0) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar8 = pIVar15->CurrentPlot;
  dVar14 = (pIVar8->XAxis).Range.Min;
  iVar16 = pTVar7->YAxis;
  IVar2 = pIVar15->PixelRange[iVar16].Min;
  IVar19.x = (float)(pIVar15->Mx *
                     (((double)(float)(dVar18 / pIVar15->LogDenX) *
                       ((pIVar8->XAxis).Range.Max - dVar14) + dVar14) - dVar14) + (double)IVar2.x);
  IVar19.y = (float)(pIVar15->My[iVar16] *
                     ((((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25)
                      + ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) -
                     pIVar8->YAxis[iVar16].Range.Min) + (double)IVar2.y);
  fVar20 = (this->P1).x;
  fVar21 = (this->P1).y;
  auVar25._0_4_ = ~-(uint)(IVar19.x <= fVar20) & (uint)IVar19.x;
  auVar25._4_4_ = ~-(uint)(IVar19.y <= fVar21) & (uint)IVar19.y;
  auVar25._8_4_ = ~-(uint)(fVar20 < IVar19.x) & (uint)IVar19.x;
  auVar25._12_4_ = ~-(uint)(fVar21 < IVar19.y) & (uint)IVar19.y;
  auVar12._4_4_ = (uint)fVar21 & -(uint)(IVar19.y <= fVar21);
  auVar12._0_4_ = (uint)fVar20 & -(uint)(IVar19.x <= fVar20);
  auVar12._8_4_ = (uint)fVar20 & -(uint)(fVar20 < IVar19.x);
  auVar12._12_4_ = (uint)fVar21 & -(uint)(fVar21 < IVar19.y);
  auVar25 = auVar25 | auVar12;
  fVar22 = (cull_rect->Min).y;
  auVar13._4_8_ = auVar25._8_8_;
  auVar13._0_4_ = -(uint)(auVar25._4_4_ < fVar22);
  auVar26._0_8_ = auVar13._0_8_ << 0x20;
  auVar26._8_4_ = -(uint)(auVar25._8_4_ < (cull_rect->Max).x);
  auVar26._12_4_ = -(uint)(auVar25._12_4_ < (cull_rect->Max).y);
  auVar27._4_4_ = -(uint)(fVar22 < auVar25._4_4_);
  auVar27._0_4_ = -(uint)((cull_rect->Min).x < auVar25._0_4_);
  auVar27._8_8_ = auVar26._8_8_;
  iVar16 = movmskps((int)pIVar8,auVar27);
  if (iVar16 == 0xf) {
    IVar4 = this->Col;
    IVar2 = *uv;
    fVar22 = IVar19.x - fVar20;
    fVar23 = IVar19.y - fVar21;
    fVar24 = fVar22 * fVar22 + fVar23 * fVar23;
    if (0.0 < fVar24) {
      fVar24 = 1.0 / SQRT(fVar24);
      fVar22 = fVar22 * fVar24;
      fVar23 = fVar23 * fVar24;
    }
    fVar24 = this->Weight * 0.5;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9->uv = IVar2;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10->col = IVar4;
    fVar22 = fVar24 * fVar22;
    fVar24 = fVar24 * fVar23;
    (pIVar9->pos).x = fVar20 + fVar24;
    (pIVar9->pos).y = fVar21 - fVar22;
    pIVar10[1].pos.x = fVar24 + IVar19.x;
    pIVar10[1].pos.y = IVar19.y - fVar22;
    pIVar10[1].uv = IVar2;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[1].col = IVar4;
    pIVar9[2].pos.x = IVar19.x - fVar24;
    pIVar9[2].pos.y = fVar22 + IVar19.y;
    pIVar9[2].uv = IVar2;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[2].col = IVar4;
    IVar3 = this->P1;
    pIVar9[3].pos.x = IVar3.x - fVar24;
    pIVar9[3].pos.y = IVar3.y + fVar22;
    pIVar9[3].uv.x = IVar2.x;
    pIVar9[3].uv.y = IVar2.y;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[3].col = IVar4;
    DrawList->_VtxWritePtr = pIVar9 + 4;
    uVar5 = DrawList->_VtxCurrentIdx;
    pIVar11 = DrawList->_IdxWritePtr;
    IVar17 = (ImDrawIdx)uVar5;
    *pIVar11 = IVar17;
    pIVar11[1] = IVar17 + 1;
    pIVar11[2] = IVar17 + 2;
    pIVar11[3] = IVar17;
    pIVar11[4] = IVar17 + 2;
    pIVar11[5] = IVar17 + 3;
    DrawList->_IdxWritePtr = pIVar11 + 6;
    DrawList->_VtxCurrentIdx = uVar5 + 4;
  }
  this->P1 = IVar19;
  return (char)iVar16 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        P1 = P2;
        return true;
    }